

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readValue(Reader *this)

{
  ValueHolder VVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  bool bVar4;
  _Elt_pointer ppVVar5;
  Token *tokenStart;
  Token token;
  ValueHolder local_50;
  ushort local_48;
  long local_40 [2];
  Token local_30;
  
  do {
    tokenStart = &local_30;
    readToken(this,&local_30);
  } while (local_30.type_ == tokenComment);
  switch(local_30.type_) {
  case tokenObjectBegin:
    bVar4 = readObject(this,tokenStart);
    return bVar4;
  default:
    local_50.string_ = (char *)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Syntax error: value, object or array expected.","");
    addError(this,(string *)&local_50,&local_30,(Location)0x0);
    if (local_50 != local_40) {
      operator_delete(local_50.string_,local_40[0] + 1);
    }
    bVar4 = false;
    break;
  case tokenArrayBegin:
    bVar4 = readArray(this,tokenStart);
    return bVar4;
  case tokenString:
    bVar4 = decodeString(this,&local_30);
    break;
  case tokenInteger:
    bVar4 = decodeNumber(this,&local_30);
    break;
  case tokenDouble:
    bVar4 = decodeDouble(this,&local_30);
    break;
  case tokenTrue:
    local_50.bool_ = true;
    goto LAB_001c5e9f;
  case tokenFalse:
    local_50.string_ = (char *)((ulong)(uint7)local_50._1_7_ << 8);
LAB_001c5e9f:
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar3 = &ppVVar5[-1]->value_;
    VVar1.string_ = *(char **)pVVar3;
    pVVar3->string_ = (char *)local_50;
    uVar2 = *(ushort *)(pVVar3 + 1);
    *(ushort *)(pVVar3 + 1) = uVar2 & 0xff00 | 5;
    *(ushort *)(pVVar3 + 1) = uVar2 & 0xfe00 | 5 | local_48 & 0x100;
    local_48 = local_48 & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100;
    local_50.string_ = VVar1.string_;
LAB_001c5f15:
    Value::~Value((Value *)&local_50);
    bVar4 = true;
    break;
  case tokenNull:
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar3 = &ppVVar5[-1]->value_;
    VVar1 = *pVVar3;
    *pVVar3 = local_50;
    uVar2 = *(ushort *)(pVVar3 + 1);
    *(ushort *)(pVVar3 + 1) = uVar2 & 0xff00;
    *(ushort *)(pVVar3 + 1) = uVar2 & 0xfe00;
    local_48 = uVar2 & 0x100 | local_48 & 0xfe00 | uVar2 & 0xff;
    local_50 = VVar1;
    goto LAB_001c5f15;
  }
  return bVar4;
}

Assistant:

bool
Reader::readValue ()
{
    Token token;
    skipCommentTokens ( token );
    bool successful = true;

    switch ( token.type_ )
    {
    case tokenObjectBegin:
        successful = readObject ( token );
        break;

    case tokenArrayBegin:
        successful = readArray ( token );
        break;

    case tokenInteger:
        successful = decodeNumber ( token );
        break;

    case tokenDouble:
        successful = decodeDouble ( token );
        break;

    case tokenString:
        successful = decodeString ( token );
        break;

    case tokenTrue:
        currentValue () = true;
        break;

    case tokenFalse:
        currentValue () = false;
        break;

    case tokenNull:
        currentValue () = Value ();
        break;

    default:
        return addError ( "Syntax error: value, object or array expected.", token );
    }

    return successful;
}